

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Get_helper(RuntimeCharSet<char16_t> *this,uint k)

{
  byte bVar1;
  CharSetNode *pCVar2;
  uint uVar3;
  bool bVar4;
  
  pCVar2 = this->root;
  uVar3 = 3;
  bVar1 = 0xc;
  while( true ) {
    bVar4 = pCVar2 == (CharSetNode *)&CharSetFull::Instance;
    if (bVar4) {
      return bVar4;
    }
    pCVar2 = (CharSetNode *)pCVar2[(ulong)(k >> (bVar1 & 0x1f) & 0xf) + 1]._vptr_CharSetNode;
    if (pCVar2 == (CharSetNode *)0x0) break;
    uVar3 = uVar3 - 1;
    bVar1 = bVar1 - 4;
    if (uVar3 < 2) {
      if (pCVar2 == (CharSetNode *)&CharSetFull::Instance) {
        bVar4 = true;
      }
      else {
        bVar4 = (*(uint *)((long)&pCVar2[1]._vptr_CharSetNode + (ulong)(k >> 3 & 0x1c)) >>
                 (k & 0x1f) & 1) != 0;
      }
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool RuntimeCharSet<char16>::Get_helper(uint k) const
    {
        CharSetNode* curr = root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }